

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::(anonymous_namespace)::Stack::
newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::AST_const*>
          (Stack *this,FrameKind args,AST *args_1)

{
  pointer __first;
  pointer __result;
  pointer pFVar1;
  pointer pFVar2;
  AST **in_RCX;
  pointer __alloc;
  undefined4 in_register_00000034;
  size_t __n;
  undefined1 local_4c [12];
  AST *local_40;
  pointer local_38;
  
  __n = CONCAT44(in_register_00000034,args);
  pFVar2 = *(pointer *)(this + 0x18);
  local_4c._0_4_ = args;
  local_40 = args_1;
  if (pFVar2 == *(pointer *)(this + 0x20)) {
    local_4c._4_8_ =
         std::
         vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
         ::_M_check_len((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                         *)(this + 0x10),__n,(char *)args_1);
    __first = *(pointer *)(this + 0x10);
    __alloc = *(pointer *)(this + 0x18);
    local_38 = __alloc;
    __result = std::
               _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ::_M_allocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                              *)local_4c._4_8_,__n);
    std::allocator_traits<std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>>::
    construct<jsonnet::internal::(anonymous_namespace)::Frame,jsonnet::internal::(anonymous_namespace)::FrameKind&,jsonnet::internal::AST_const*&>
              ((allocator_type *)(((long)pFVar2 - (long)__first) + (long)__result),(Frame *)local_4c
               ,(FrameKind *)&local_40,(AST **)__alloc);
    pFVar1 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__first,pFVar2,__result,(_Tp_alloc_type *)__alloc);
    pFVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(pFVar2,local_38,pFVar1 + 1,(_Tp_alloc_type *)__alloc);
    std::
    _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
    ::_M_deallocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                     *)__first,(pointer)((*(long *)(this + 0x20) - (long)__first) / 400),
                    (*(long *)(this + 0x20) - (long)__first) % 400);
    *(pointer *)(this + 0x10) = __result;
    *(pointer *)(this + 0x18) = pFVar2;
    *(pointer *)(this + 0x20) = __result + local_4c._4_8_;
  }
  else {
    std::allocator_traits<std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>>::
    construct<jsonnet::internal::(anonymous_namespace)::Frame,jsonnet::internal::(anonymous_namespace)::FrameKind&,jsonnet::internal::AST_const*&>
              ((allocator_type *)pFVar2,(Frame *)local_4c,(FrameKind *)&local_40,in_RCX);
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 400;
  }
  return;
}

Assistant:

void newFrame(Args... args)
    {
        stack.emplace_back(args...);
    }